

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

dtime_t duckdb::TryCastCInternal<duckdb_blob,duckdb::dtime_t,duckdb::FromCBlobCastWrapper>
                  (duckdb_result *result,idx_t col,idx_t row)

{
  dtime_t dVar1;
  
  dVar1 = FetchDefaultValue::Operation<duckdb::dtime_t>();
  return (dtime_t)dVar1.micros;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}